

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O3

void skip_variable(void)

{
  uint uVar1;
  uint __c;
  ushort **ppuVar2;
  int iVar3;
  int in_EDI;
  
  uVar1 = read_2_bytes();
  if (1 < uVar1) {
    for (iVar3 = uVar1 - 2; iVar3 != 0; iVar3 = iVar3 + -1) {
      read_1_byte();
    }
    return;
  }
  skip_variable_cold_1();
  setlocale(0,"");
  uVar1 = read_2_bytes();
  if (uVar1 < 2) {
    process_COM_cold_1();
    iVar3 = getc((FILE *)infile);
    if (iVar3 != -1) {
      return;
    }
    read_1_byte_cold_1();
    iVar3 = getc((FILE *)infile);
    if (iVar3 == -1) {
      read_2_bytes_cold_2();
    }
    else {
      iVar3 = getc((FILE *)infile);
      if (iVar3 != -1) {
        return;
      }
    }
    read_2_bytes_cold_1();
    halt_baddata();
  }
  iVar3 = uVar1 - 2;
  if (iVar3 != 0) {
    uVar1 = 0;
    do {
      __c = read_1_byte();
      if (in_EDI == 0) {
        if (__c == 10) {
          if (uVar1 != 0xd) {
LAB_00101879:
            putchar(10);
          }
        }
        else if (__c == 0x5c) {
          printf("\\\\");
        }
        else {
          if (__c == 0xd) goto LAB_00101879;
          ppuVar2 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar2 + (long)(int)__c * 2 + 1) & 0x40) != 0) goto LAB_0010181e;
          printf("\\%03o",(ulong)__c);
        }
      }
      else {
LAB_0010181e:
        putc(__c,_stdout);
      }
      iVar3 = iVar3 + -1;
      uVar1 = __c;
    } while (iVar3 != 0);
  }
  putchar(10);
  setlocale(0,"C");
  return;
}

Assistant:

static void
skip_variable(void)
/* Skip over an unknown or uninteresting variable-length marker */
{
  unsigned int length;

  /* Get the marker parameter length count */
  length = read_2_bytes();
  /* Length includes itself, so must be at least 2 */
  if (length < 2)
    ERREXIT("Erroneous JPEG marker length");
  length -= 2;
  /* Skip over the remaining bytes */
  while (length > 0) {
    (void)read_1_byte();
    length--;
  }
}